

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O3

void __thiscall
EnvironmentNAVXYTHETALAT::GetLazySuccs
          (EnvironmentNAVXYTHETALAT *this,int SourceStateID,
          vector<int,_std::allocator<int>_> *SuccIDV,vector<int,_std::allocator<int>_> *CostV,
          vector<bool,_std::allocator<bool>_> *isTrueCost,
          vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_> *actionV)

{
  pointer piVar1;
  pointer ppEVar2;
  EnvNAVXYTHETALATHashEntry_t *pEVar3;
  EnvNAVXYTHETALATAction_t *pEVar4;
  iterator iVar5;
  iterator __position;
  vector<EnvNAVXYTHETALATAction_t*,std::allocator<EnvNAVXYTHETALATAction_t*>> *this_00;
  int iVar6;
  int iVar7;
  int *piVar8;
  code *pcVar9;
  long lVar10;
  uint uVar11;
  long *plVar12;
  long lVar13;
  uint uVar14;
  int cost;
  EnvNAVXYTHETALATAction_t *nav3daction;
  uint local_5c;
  vector<int,std::allocator<int>> *local_58;
  EnvNAVXYTHETALATAction_t *local_50;
  vector<bool,_std::allocator<bool>_> *local_48;
  vector<EnvNAVXYTHETALATAction_t*,std::allocator<EnvNAVXYTHETALATAction_t*>> *local_40;
  vector<int,std::allocator<int>> *local_38;
  
  piVar1 = (SuccIDV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((SuccIDV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (SuccIDV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  piVar1 = (CostV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((CostV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (CostV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = piVar1;
  }
  local_48 = isTrueCost;
  std::vector<int,_std::allocator<int>_>::reserve
            (SuccIDV,(long)(this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.
                           actionwidth);
  std::vector<int,_std::allocator<int>_>::reserve
            (CostV,(long)(this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.actionwidth)
  ;
  std::vector<bool,_std::allocator<bool>_>::reserve
            (local_48,(long)(this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.
                            actionwidth);
  if (actionV !=
      (vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_> *)0x0) {
    ppEVar2 = (actionV->
              super__Vector_base<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((actionV->
        super__Vector_base<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>)
        ._M_impl.super__Vector_impl_data._M_finish != ppEVar2) {
      (actionV->
      super__Vector_base<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>).
      _M_impl.super__Vector_impl_data._M_finish = ppEVar2;
    }
    std::vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>::reserve
              (actionV,(long)(this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.
                             actionwidth);
  }
  if (((this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALAT.goalstateid != SourceStateID) &&
     (0 < (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.actionwidth)) {
    pEVar3 = (this->StateID2CoordTable).
             super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
             ._M_impl.super__Vector_impl_data._M_start[SourceStateID];
    lVar13 = 0;
    lVar10 = 0;
    local_58 = (vector<int,std::allocator<int>> *)CostV;
    local_40 = (vector<EnvNAVXYTHETALATAction_t*,std::allocator<EnvNAVXYTHETALATAction_t*>> *)
               actionV;
    local_38 = (vector<int,std::allocator<int>> *)SuccIDV;
    do {
      pEVar4 = (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.ActionsV
               [(uint)(int)pEVar3->Theta];
      local_50 = (EnvNAVXYTHETALATAction_t *)(&pEVar4->aind + lVar13);
      uVar11 = (int)(&pEVar4->dX)[lVar13] + pEVar3->X;
      uVar14 = (int)(&pEVar4->dY)[lVar13] + pEVar3->Y;
      iVar6 = (*(this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
                _vptr_DiscreteSpaceInformation[0x24])
                        (this,(ulong)(uint)(int)(&pEVar4->endtheta)[lVar13]);
      iVar7 = (*(this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
                _vptr_DiscreteSpaceInformation[0x41])(this,(ulong)uVar11,(ulong)uVar14);
      if ((char)iVar7 != '\0') {
        if (local_40 ==
            (vector<EnvNAVXYTHETALATAction_t*,std::allocator<EnvNAVXYTHETALATAction_t*>> *)0x0) {
          pcVar9 = (code *)this->GetHashEntry;
          plVar12 = (long *)((long)&(this->super_EnvironmentNAVXYTHETALATTICE).
                                    super_DiscreteSpaceInformation._vptr_DiscreteSpaceInformation +
                            *(long *)&this->field_0x1c8);
          if (((ulong)pcVar9 & 1) != 0) {
            pcVar9 = *(code **)(pcVar9 + *plVar12 + -1);
          }
          piVar8 = (int *)(*pcVar9)(plVar12,uVar11,uVar14,iVar6);
          if (piVar8 == (int *)0x0) {
            pcVar9 = (code *)this->CreateNewHashEntry;
            plVar12 = (long *)((long)&(this->super_EnvironmentNAVXYTHETALATTICE).
                                      super_DiscreteSpaceInformation._vptr_DiscreteSpaceInformation
                              + *(long *)&this->field_0x1d8);
            if (((ulong)pcVar9 & 1) != 0) {
              pcVar9 = *(code **)(pcVar9 + *plVar12 + -1);
            }
            piVar8 = (int *)(*pcVar9)(plVar12,uVar11,uVar14,iVar6);
          }
          iVar5._M_current = *(int **)(local_38 + 8);
          if (iVar5._M_current == *(int **)(local_38 + 0x10)) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (local_38,iVar5,piVar8);
          }
          else {
            *iVar5._M_current = *piVar8;
            *(int **)(local_38 + 8) = iVar5._M_current + 1;
          }
          local_5c = local_50->cost;
          iVar5._M_current = *(int **)(local_58 + 8);
          if (iVar5._M_current == *(int **)(local_58 + 0x10)) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)local_58,iVar5,(int *)&local_5c);
          }
          else {
            *iVar5._M_current = local_5c;
            *(int **)(local_58 + 8) = iVar5._M_current + 1;
          }
          std::vector<bool,_std::allocator<bool>_>::push_back(local_48,false);
        }
        else {
          local_5c = (*(this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
                       _vptr_DiscreteSpaceInformation[0x36])
                               (this,(ulong)(uint)pEVar3->X,(ulong)(uint)pEVar3->Y,
                                (ulong)(uint)(int)pEVar3->Theta,local_50);
          if ((int)local_5c < 1000000000) {
            pcVar9 = (code *)this->GetHashEntry;
            plVar12 = (long *)((long)&(this->super_EnvironmentNAVXYTHETALATTICE).
                                      super_DiscreteSpaceInformation._vptr_DiscreteSpaceInformation
                              + *(long *)&this->field_0x1c8);
            if (((ulong)pcVar9 & 1) != 0) {
              pcVar9 = *(code **)(pcVar9 + *plVar12 + -1);
            }
            piVar8 = (int *)(*pcVar9)(plVar12,uVar11,uVar14,iVar6);
            if (piVar8 == (int *)0x0) {
              pcVar9 = (code *)this->CreateNewHashEntry;
              plVar12 = (long *)((long)&(this->super_EnvironmentNAVXYTHETALATTICE).
                                        super_DiscreteSpaceInformation.
                                        _vptr_DiscreteSpaceInformation + *(long *)&this->field_0x1d8
                                );
              if (((ulong)pcVar9 & 1) != 0) {
                pcVar9 = *(code **)(pcVar9 + *plVar12 + -1);
              }
              piVar8 = (int *)(*pcVar9)(plVar12,uVar11,uVar14,iVar6);
            }
            iVar5._M_current = *(int **)(local_38 + 8);
            if (iVar5._M_current == *(int **)(local_38 + 0x10)) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_38,iVar5,piVar8);
            }
            else {
              *iVar5._M_current = *piVar8;
              *(int **)(local_38 + 8) = iVar5._M_current + 1;
            }
            this_00 = local_40;
            iVar5._M_current = *(int **)(local_58 + 8);
            if (iVar5._M_current == *(int **)(local_58 + 0x10)) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_58,iVar5,(int *)&local_5c);
            }
            else {
              *iVar5._M_current = local_5c;
              *(int **)(local_58 + 8) = iVar5._M_current + 1;
            }
            std::vector<bool,_std::allocator<bool>_>::push_back(local_48,true);
            __position._M_current = *(EnvNAVXYTHETALATAction_t ***)(this_00 + 8);
            if (__position._M_current == *(EnvNAVXYTHETALATAction_t ***)(this_00 + 0x10)) {
              std::vector<EnvNAVXYTHETALATAction_t*,std::allocator<EnvNAVXYTHETALATAction_t*>>::
              _M_realloc_insert<EnvNAVXYTHETALATAction_t*const&>(this_00,__position,&local_50);
            }
            else {
              *__position._M_current = local_50;
              *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
            }
          }
        }
      }
      lVar10 = lVar10 + 1;
      lVar13 = lVar13 + 0x68;
    } while (lVar10 < (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.actionwidth);
  }
  return;
}

Assistant:

void EnvironmentNAVXYTHETALAT::GetLazySuccs(
    int SourceStateID,
    std::vector<int>* SuccIDV,
    std::vector<int>* CostV,
    std::vector<bool>* isTrueCost,
    std::vector<EnvNAVXYTHETALATAction_t*>* actionV)
{
    int aind;

#if TIME_DEBUG
    clock_t currenttime = clock();
#endif

    // clear the successor array
    SuccIDV->clear();
    CostV->clear();
    SuccIDV->reserve(EnvNAVXYTHETALATCfg.actionwidth);
    CostV->reserve(EnvNAVXYTHETALATCfg.actionwidth);
    isTrueCost->reserve(EnvNAVXYTHETALATCfg.actionwidth);
    if (actionV != NULL) {
        actionV->clear();
        actionV->reserve(EnvNAVXYTHETALATCfg.actionwidth);
    }

    // goal state should be absorbing
    if (SourceStateID == EnvNAVXYTHETALAT.goalstateid) {
        return;
    }

    // get X, Y for the state
    EnvNAVXYTHETALATHashEntry_t* HashEntry = StateID2CoordTable[SourceStateID];

    // iterate through actions
    for (aind = 0; aind < EnvNAVXYTHETALATCfg.actionwidth; aind++) {
        EnvNAVXYTHETALATAction_t* nav3daction = &EnvNAVXYTHETALATCfg.ActionsV[(unsigned int)HashEntry->Theta][aind];
        int newX = HashEntry->X + nav3daction->dX;
        int newY = HashEntry->Y + nav3daction->dY;
        int newTheta = normalizeDiscAngle(nav3daction->endtheta);

        // skip the invalid cells
        if (!IsValidCell(newX, newY)) {
            continue;
        }

        // if we are supposed to return the action, then don't do lazy
        if (!actionV) {
            EnvNAVXYTHETALATHashEntry_t* OutHashEntry;
            if ((OutHashEntry = (this->*GetHashEntry)(newX, newY, newTheta)) == NULL) {
                OutHashEntry = (this->*CreateNewHashEntry)(newX, newY, newTheta);
            }
            SuccIDV->push_back(OutHashEntry->stateID);
            CostV->push_back(nav3daction->cost);
            isTrueCost->push_back(false);
            continue;
        }

        // get cost
        int cost = GetActionCost(HashEntry->X, HashEntry->Y, HashEntry->Theta, nav3daction);
        if (cost >= INFINITECOST) {
            continue;
        }

        EnvNAVXYTHETALATHashEntry_t* OutHashEntry;
        if ((OutHashEntry = (this->*GetHashEntry)(newX, newY, newTheta)) == NULL) {
            // have to create a new entry
            OutHashEntry = (this->*CreateNewHashEntry)(newX, newY, newTheta);
        }

        SuccIDV->push_back(OutHashEntry->stateID);
        CostV->push_back(cost);
        isTrueCost->push_back(true);
        if (actionV != NULL) {
            actionV->push_back(nav3daction);
        }
    }

#if TIME_DEBUG
    time_getsuccs += clock()-currenttime;
#endif
}